

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

MDD lddmc_follow(MDD mdd,uint32_t value)

{
  uint8_t uVar1;
  uint32_t uVar2;
  mddnode_t n_00;
  uint64_t uVar3;
  uint32_t v;
  mddnode_t n;
  MDD MStack_18;
  uint32_t value_local;
  MDD mdd_local;
  
  MStack_18 = mdd;
  do {
    if (MStack_18 < 2) {
      return MStack_18;
    }
    n_00 = LDD_GETNODE(MStack_18);
    uVar1 = mddnode_getcopy(n_00);
    if (uVar1 == '\0') {
      uVar2 = mddnode_getvalue(n_00);
      if (uVar2 == value) {
        uVar3 = mddnode_getdown(n_00);
        return uVar3;
      }
      if (value < uVar2) {
        return 0;
      }
    }
    MStack_18 = mddnode_getright(n_00);
  } while( true );
}

Assistant:

MDD
lddmc_follow(MDD mdd, uint32_t value)
{
    for (;;) {
        if (mdd <= lddmc_true) return mdd;
        const mddnode_t n = LDD_GETNODE(mdd);
        if (!mddnode_getcopy(n)) {
            const uint32_t v = mddnode_getvalue(n);
            if (v == value) return mddnode_getdown(n);
            if (v > value) return lddmc_false;
        }
        mdd = mddnode_getright(n);
    }
}